

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::SolveSystemPhi
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  TPZFMatrix<std::complex<long_double>_> *this_00;
  complex<long_double> value;
  complex<long_double> *pcVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long newCols;
  TPZFMatrix<std::complex<long_double>_> I_lambda;
  TPZFMatrix<std::complex<long_double>_> Lambda_star;
  TPZFMatrix<std::complex<long_double>_> local_178;
  undefined8 local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  undefined8 local_d8;
  undefined2 uStack_d0;
  undefined6 uStack_ce;
  TPZFMatrix<std::complex<long_double>_> local_c0;
  
  uVar4 = (uint)(this->fCoarseIndex).fNElements;
  newCols = (long)(int)uVar4;
  lVar2 = (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow +
          newCols;
  local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01845fb8;
  local_178.fElem = (complex<long_double> *)0x0;
  local_178.fGiven = (complex<long_double> *)0x0;
  local_178.fSize = 0;
  local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = lVar2;
  local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = newCols;
  TPZVec<int>::TPZVec(&local_178.fPivot.super_TPZVec<int>,0);
  local_178.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_178.fPivot.super_TPZVec<int>.fStore = local_178.fPivot.fExtAlloc;
  local_178.fPivot.super_TPZVec<int>.fNElements = 0;
  local_178.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_178.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018462a8;
  local_178.fWork.fStore = (complex<long_double> *)0x0;
  local_178.fWork.fNElements = 0;
  local_178.fWork.fNAlloc = 0;
  uVar3 = lVar2 * newCols;
  if (uVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar3 < 0x800000000000000) {
      uVar5 = uVar3 * 0x20;
    }
    local_178.fElem = (complex<long_double> *)operator_new__(uVar5);
    pcVar1 = local_178.fElem;
    do {
      *(longdouble *)pcVar1->_M_value = (longdouble)0;
      *(longdouble *)((long)pcVar1->_M_value + 0x10) = (longdouble)0;
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != local_178.fElem + uVar3);
  }
  memset(local_178.fElem,0,
         local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow *
         local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol * 0x20);
  local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._24_2_ =
       local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      if ((local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow <=
           (long)uVar3) ||
         (local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol <=
          (long)uVar3)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(longdouble *)
       local_178.fElem
       [local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * uVar3 +
        uVar3]._M_value = (longdouble)1;
      *(longdouble *)
       ((long)local_178.fElem
              [local_178.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow *
               uVar3 + uVar3]._M_value + 0x10) = (longdouble)0;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  lVar2 = (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow +
          newCols;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01845fb8;
  local_c0.fElem = (complex<long_double> *)0x0;
  local_c0.fGiven = (complex<long_double> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = lVar2;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = newCols;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018462a8;
  local_c0.fWork.fStore = (complex<long_double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar3 = lVar2 * newCols;
  if (uVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar3 < 0x800000000000000) {
      uVar5 = uVar3 * 0x20;
    }
    local_c0.fElem = (complex<long_double> *)operator_new__(uVar5);
    pcVar1 = local_c0.fElem;
    do {
      *(longdouble *)pcVar1->_M_value = (longdouble)0;
      *(longdouble *)((long)pcVar1->_M_value + 0x10) = (longdouble)0;
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != local_c0.fElem + uVar3);
  }
  TPZStepSolver<std::complex<long_double>_>::Solve
            (&this->finv,&local_178,&local_c0,(TPZFMatrix<std::complex<long_double>_> *)0x0);
  this_00 = &this->fPhiC;
  TPZFMatrix<std::complex<long_double>_>::Resize(this_00,(long)this->fNEquations,newCols);
  TPZMatrix<std::complex<long_double>_>::Multiply
            (&(this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>,&local_c0,this_00,0);
  local_e8 = SUB108(-(longdouble)1,0);
  uStack_e0 = (undefined2)((unkuint10)-(longdouble)1 >> 0x40);
  local_d8 = SUB108((longdouble)0,0);
  uStack_d0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  value._M_value._10_6_ = uStack_de;
  value._M_value._8_2_ = uStack_e0;
  value._M_value._26_6_ = uStack_ce;
  value._M_value._24_2_ = uStack_d0;
  value._M_value._0_8_ = local_e8;
  value._M_value._16_8_ = local_d8;
  TPZFMatrix<std::complex<long_double>_>::operator*=(this_00,value);
  ComputeCoarseStiffness(this);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_178);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseIndex.NElements();
	int i;
	//  I_star.Print("fIStar = ",out,EMathematicaInput);
	//  std::cout << "Nci: ";
	//  std::cout << ncoarse;// << endl;
	//  std::cout << endl;
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+fNullPivots.Rows(),ncoarse);
	I_lambda.Zero();
	for (i=0;i<ncoarse;i++) {
		I_lambda(i,i)=1;
	}
	//  I_lambda.Print("ILambda = ",out,EMathematicaInput);
	
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+fNullPivots.Rows(),ncoarse);
	//  temp1->Print("temp1 = ",out,EMathematicaInput);
	//  out.flush();
	finv.Solve(I_lambda, Lambda_star);
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("matrix lambda star",sout );
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining Phi
	/** Acho q posso comentar essas duas linhas abaixo, pq naum tou vendo aplicacao pra temp2 */
	/*
	 TPZFMatrix<TVar> temp2(fNEquations,ncoarse);
	 C_star.MultAdd(Lambda_star,Lambda_star,temp2,-1,0,1,1);
	 */
	fPhiC.Resize(fNEquations,ncoarse);
	fKeC_star.Multiply(Lambda_star,fPhiC);
	fPhiC *= -1.;
	ComputeCoarseStiffness();
	//  fPhiC.Print("PhiC = ",out,EMathematicaInput);
	//  fC.Print("Ci = ",std::cout,EMathematicaInput);
}